

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PortConnection * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PortConnection,slang::ast::PortSymbol_const&,slang::ast::InstanceSymbol_const&,slang::ast::Symbol_const*&,slang::SourceRange&>
          (BumpAllocator *this,PortSymbol *args,InstanceSymbol *args_1,Symbol **args_2,
          SourceRange *args_3)

{
  PortConnection *this_00;
  SourceRange *args_local_3;
  Symbol **args_local_2;
  InstanceSymbol *args_local_1;
  PortSymbol *args_local;
  BumpAllocator *this_local;
  
  this_00 = (PortConnection *)allocate(this,0x38,8);
  ast::PortConnection::PortConnection(this_00,&args->super_Symbol,args_1,*args_2,*args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }